

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O1

Parsekey __thiscall
free_format_parser::HMpsFF::checkFirstWord
          (HMpsFF *this,string *strline,size_t *start,size_t *end,string *word)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  Parsekey PVar6;
  Parsekey PVar7;
  string upper_word;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  sVar5 = std::__cxx11::string::find_first_not_of((char *)strline,0x3c5f01,0);
  *start = sVar5;
  if ((sVar5 + 1 == strline->_M_string_length) ||
     (bVar2 = is_empty((strline->_M_dataplus)._M_p[sVar5 + 1],&default_non_chars_abi_cxx11_), bVar2)
     ) {
    *end = *start + 1;
    std::__cxx11::string::_M_replace_aux((ulong)word,0,word->_M_string_length,'\x01');
    return kNone;
  }
  sVar5 = first_word_end(strline,*start + 1);
  *end = sVar5;
  std::__cxx11::string::substr((ulong)local_70,(ulong)strline);
  std::__cxx11::string::operator=((string *)word,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  local_70[0] = local_60;
  pcVar1 = (word->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + word->_M_string_length);
  toupper((int)(string *)local_70);
  iVar3 = std::__cxx11::string::compare((char *)local_70);
  if (((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_70), iVar3 == 0)) ||
     (iVar3 = std::__cxx11::string::compare((char *)local_70), iVar3 == 0)) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)strline);
    std::__cxx11::string::operator=((string *)&this->section_args,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)local_70);
  if (iVar3 == 0) {
    PVar6 = kName;
    PVar7 = kName;
    goto LAB_001fd321;
  }
  iVar4 = std::__cxx11::string::compare((char *)local_70);
  bVar2 = true;
  if (iVar4 == 0) {
    PVar6 = kObjsense;
    PVar7 = kObjsense;
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
    iVar4 = std::__cxx11::string::compare((char *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (iVar4 == 0) {
      bVar2 = false;
      PVar6 = kMax;
      PVar7 = kMax;
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
      iVar4 = std::__cxx11::string::compare((char *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (iVar4 == 0) {
        bVar2 = false;
        PVar6 = kMin;
        PVar7 = kMin;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)local_70);
        if (iVar4 == 0) {
          PVar6 = kRows;
          PVar7 = kRows;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)local_70);
          if (iVar4 == 0) {
            PVar6 = kCols;
            PVar7 = kCols;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)local_70);
            if (iVar4 == 0) {
              PVar6 = kRhs;
              PVar7 = kRhs;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)local_70);
              if (iVar4 == 0) {
                PVar6 = kBounds;
                PVar7 = kBounds;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)local_70);
                if (iVar4 == 0) {
                  PVar6 = kRanges;
                  PVar7 = kRanges;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)local_70);
                  if (iVar4 == 0) {
                    PVar6 = kQsection;
                    PVar7 = kQsection;
                    goto LAB_001fd342;
                  }
                  iVar4 = std::__cxx11::string::compare((char *)local_70);
                  if (iVar4 == 0) {
                    PVar6 = kQmatrix;
                    PVar7 = kQmatrix;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)local_70);
                    if (iVar4 == 0) {
                      PVar6 = kQuadobj;
                      PVar7 = kQuadobj;
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)local_70);
                      if (iVar4 == 0) {
                        PVar6 = kQcmatrix;
                        PVar7 = kQcmatrix;
                        goto LAB_001fd342;
                      }
                      iVar4 = std::__cxx11::string::compare((char *)local_70);
                      if (iVar4 == 0) {
                        PVar6 = kCsection;
                        PVar7 = kCsection;
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)local_70);
                        if (iVar4 == 0) {
                          PVar6 = kDelayedrows;
                          PVar7 = kDelayedrows;
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare((char *)local_70);
                          if (iVar4 == 0) {
                            PVar6 = kModelcuts;
                            PVar7 = kModelcuts;
                          }
                          else {
                            iVar4 = std::__cxx11::string::compare((char *)local_70);
                            if (iVar4 != 0) {
                              iVar4 = std::__cxx11::string::compare((char *)local_70);
                              if (iVar4 == 0) {
                                PVar6 = kIndicators;
                                PVar7 = kIndicators;
                              }
                              else {
                                iVar4 = std::__cxx11::string::compare((char *)local_70);
                                if (iVar4 == 0) {
                                  PVar6 = kSets;
                                  PVar7 = kSets;
                                }
                                else {
                                  iVar4 = std::__cxx11::string::compare((char *)local_70);
                                  if (iVar4 == 0) {
                                    PVar6 = kSos;
                                    PVar7 = kSos;
                                  }
                                  else {
                                    iVar4 = std::__cxx11::string::compare((char *)local_70);
                                    if (iVar4 == 0) {
                                      PVar6 = kGencons;
                                      PVar7 = kGencons;
                                    }
                                    else {
                                      iVar4 = std::__cxx11::string::compare((char *)local_70);
                                      if (iVar4 == 0) {
                                        PVar6 = kPwlobj;
                                        PVar7 = kPwlobj;
                                      }
                                      else {
                                        iVar4 = std::__cxx11::string::compare((char *)local_70);
                                        if (iVar4 == 0) {
                                          PVar6 = kPwlnam;
                                          PVar7 = kPwlnam;
                                        }
                                        else {
                                          iVar4 = std::__cxx11::string::compare((char *)local_70);
                                          if (iVar4 == 0) {
                                            PVar6 = kPwlcon;
                                            PVar7 = kPwlcon;
                                          }
                                          else {
                                            iVar4 = std::__cxx11::string::compare((char *)local_70);
                                            PVar7 = kNone;
                                            if (iVar4 != 0) goto LAB_001fd36a;
                                            PVar6 = kEnd;
                                            PVar7 = kEnd;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              bVar2 = false;
                              goto LAB_001fd342;
                            }
                            PVar6 = kUsercuts;
                            PVar7 = kUsercuts;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_001fd321:
        bVar2 = false;
      }
    }
  }
LAB_001fd342:
  if ((iVar3 != 0 && !bVar2) &&
     (bVar2 = is_end(strline,*end,&default_non_chars_abi_cxx11_), PVar7 = PVar6, !bVar2)) {
    PVar7 = kNone;
  }
LAB_001fd36a:
  if (local_70[0] == local_60) {
    return PVar7;
  }
  operator_delete(local_70[0]);
  return PVar7;
}

Assistant:

HMpsFF::Parsekey HMpsFF::checkFirstWord(std::string& strline, size_t& start,
                                        size_t& end, std::string& word) const {
  start = strline.find_first_not_of(" ");
  if ((start + 1 == strline.size()) || is_empty(strline[start + 1])) {
    end = start + 1;
    word = strline[start];
    return HMpsFF::Parsekey::kNone;
  }

  end = first_word_end(strline, start + 1);

  word = strline.substr(start, end - start);

  // Create an upper-case version of WORD, so that keywords are
  // read as if they were in lower or mixed case
  std::string upper_word = word;
  toupper(upper_word);

  // store rest of strline for keywords that have arguments
  if (upper_word == "QCMATRIX" || upper_word == "QSECTION" ||
      upper_word == "CSECTION")
    section_args = strline.substr(end, strline.length());

  HMpsFF::Parsekey key;

  if (upper_word == "NAME")
    key = HMpsFF::Parsekey::kName;
  else if (upper_word == "OBJSENSE")
    key = HMpsFF::Parsekey::kObjsense;
  else if (upper_word.substr(0, 3) == "MAX")
    key = HMpsFF::Parsekey::kMax;
  else if (upper_word.substr(0, 3) == "MIN")
    key = HMpsFF::Parsekey::kMin;
  else if (upper_word == "ROWS")
    key = HMpsFF::Parsekey::kRows;
  else if (upper_word == "COLUMNS")
    key = HMpsFF::Parsekey::kCols;
  else if (upper_word == "RHS")
    key = HMpsFF::Parsekey::kRhs;
  else if (upper_word == "BOUNDS")
    key = HMpsFF::Parsekey::kBounds;
  else if (upper_word == "RANGES")
    key = HMpsFF::Parsekey::kRanges;
  else if (upper_word == "QSECTION")
    key = HMpsFF::Parsekey::kQsection;
  else if (upper_word == "QMATRIX")
    key = HMpsFF::Parsekey::kQmatrix;
  else if (upper_word == "QUADOBJ")
    key = HMpsFF::Parsekey::kQuadobj;
  else if (upper_word == "QCMATRIX")
    key = HMpsFF::Parsekey::kQcmatrix;
  else if (upper_word == "CSECTION")
    key = HMpsFF::Parsekey::kCsection;
  else if (upper_word == "DELAYEDROWS")
    key = HMpsFF::Parsekey::kDelayedrows;
  else if (upper_word == "MODELCUTS")
    key = HMpsFF::Parsekey::kModelcuts;
  else if (upper_word == "USERCUTS")
    key = HMpsFF::Parsekey::kUsercuts;
  else if (upper_word == "INDICATORS")
    key = HMpsFF::Parsekey::kIndicators;
  else if (upper_word == "SETS")
    key = HMpsFF::Parsekey::kSets;
  else if (upper_word == "SOS")
    key = HMpsFF::Parsekey::kSos;
  else if (upper_word == "GENCONS")
    key = HMpsFF::Parsekey::kGencons;
  else if (upper_word == "PWLOBJ")
    key = HMpsFF::Parsekey::kPwlobj;
  else if (upper_word == "PWLNAM")
    key = HMpsFF::Parsekey::kPwlnam;
  else if (upper_word == "PWLCON")
    key = HMpsFF::Parsekey::kPwlcon;
  else if (upper_word == "ENDATA")
    key = HMpsFF::Parsekey::kEnd;
  else
    return HMpsFF::Parsekey::kNone;
  // Can have keywords used as column names or names of RHS, BOUND,
  // RANGES etc, so assume this if there are non-blanks after the
  // apparent keyword. Only cases that don't work are NAME, OBJSENSE,
  // QCMATRIX and QSECTION, since they can be followed by text
  if (key == HMpsFF::Parsekey::kName || key == HMpsFF::Parsekey::kObjsense ||
      key == HMpsFF::Parsekey::kQcmatrix || key == HMpsFF::Parsekey::kQsection)
    return key;
  assert(key != HMpsFF::Parsekey::kNone);

  if (is_end(strline, end)) return key;

  return HMpsFF::Parsekey::kNone;
}